

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void av1_visit_palette(AV1Decoder *pbi,MACROBLOCKD *xd,aom_reader *r,palette_visitor_fn_t visit)

{
  int iVar1;
  code *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int plane;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_24;
  
  iVar1 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar1 == 0) {
    local_24 = 0;
    while( true ) {
      iVar1 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3b60));
      if (iVar1 < 3) {
        iVar1 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3b60));
      }
      else {
        iVar1 = 2;
      }
      if (iVar1 <= local_24) break;
      if (((local_24 == 0) || ((*(byte *)(in_RSI + 0xc) & 1) != 0)) &&
         (*(char *)(**(long **)(in_RSI + 0x1eb8) + 0x8e + (long)local_24) != '\0')) {
        (*in_RCX)(in_RSI,local_24,in_RDX);
      }
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void av1_visit_palette(AV1Decoder *const pbi, MACROBLOCKD *const xd,
                       aom_reader *r, palette_visitor_fn_t visit) {
  if (!is_inter_block(xd->mi[0])) {
    for (int plane = 0; plane < AOMMIN(2, av1_num_planes(&pbi->common));
         ++plane) {
      if (plane == 0 || xd->is_chroma_ref) {
        if (xd->mi[0]->palette_mode_info.palette_size[plane])
          visit(xd, plane, r);
      } else {
        assert(xd->mi[0]->palette_mode_info.palette_size[plane] == 0);
      }
    }
  }
}